

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O1

void __thiscall
BanMan::Ban(BanMan *this,CNetAddr *net_addr,int64_t ban_time_offset,bool since_unix_epoch)

{
  long in_FS_OFFSET;
  CSubNet sub_net;
  direct_or_indirect local_60;
  uint local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet::CSubNet((CSubNet *)&local_60.indirect_contents,net_addr);
  Ban(this,(CSubNet *)&local_60.indirect_contents,ban_time_offset,since_unix_epoch);
  if (0x10 < local_50) {
    free(local_60.indirect_contents.indirect);
    local_60.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::Ban(const CNetAddr& net_addr, int64_t ban_time_offset, bool since_unix_epoch)
{
    CSubNet sub_net(net_addr);
    Ban(sub_net, ban_time_offset, since_unix_epoch);
}